

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapimages.cpp
# Opt level: O1

void __thiscall CMapImages::LoadMapImages(CMapImages *this,IMap *pMap,CLayers *pLayers,int MapType)

{
  IGraphics *pIVar1;
  bool bVar2;
  CMapItemLayer *pCVar3;
  int *piVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  anon_struct_260_2_b6f809b8 *paVar9;
  int iVar10;
  anon_struct_260_2_b6f809b8 *paVar11;
  ulong uVar12;
  bool bVar13;
  long in_FS_OFFSET;
  int Start;
  char Buf [512];
  int local_23c;
  char local_238 [512];
  long local_38;
  undefined4 extraout_var;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((uint)MapType < 2) {
    paVar11 = this->m_Info + (uint)MapType;
    if (0 < this->m_Info[(uint)MapType].m_Count) {
      lVar7 = 0;
      paVar9 = paVar11;
      do {
        pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
        (*(pIVar1->super_IInterface)._vptr_IInterface[0xf])(pIVar1,paVar9);
        lVar7 = lVar7 + 1;
        paVar9 = (anon_struct_260_2_b6f809b8 *)(paVar9->m_aTextures + 1);
      } while (lVar7 < this->m_Info[(uint)MapType].m_Count);
    }
    this->m_Info[(uint)MapType].m_Count = 0;
    (*(pMap->super_IInterface)._vptr_IInterface[6])(pMap,2,&local_23c);
    iVar10 = this->m_Info[(uint)MapType].m_Count;
    iVar5 = 0x40;
    if (iVar10 < 0x40) {
      iVar5 = iVar10;
    }
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    this->m_Info[(uint)MapType].m_Count = iVar5;
    if (0 < iVar10) {
      uVar8 = 0;
      do {
        if (pLayers->m_LayersNum < 1) {
          uVar12 = 0;
        }
        else {
          bVar13 = false;
          bVar2 = false;
          iVar10 = 0;
          do {
            pCVar3 = CLayers::GetLayer(pLayers,iVar10);
            if (((!bVar13) && (pCVar3->m_Type == 3)) && (uVar8 == (uint)pCVar3[2].m_Version)) {
              bVar13 = true;
            }
            if (((!bVar2) && (pCVar3->m_Type == 2)) && (uVar8 == (uint)pCVar3[4].m_Type)) {
              bVar2 = true;
            }
            iVar10 = iVar10 + 1;
          } while (iVar10 < pLayers->m_LayersNum);
          uVar12 = (ulong)((uint)bVar13 * 4 + 4);
          if (!bVar2) {
            uVar12 = 0;
          }
        }
        iVar10 = (*(pMap->super_IInterface)._vptr_IInterface[5])
                           (pMap,(ulong)(uint)(local_23c + (int)uVar8),0,0);
        piVar4 = (int *)CONCAT44(extraout_var,iVar10);
        if ((piVar4[3] == 0) && ((*piVar4 < 2 || ((uint)piVar4[6] < 2)))) {
          iVar10 = (*(pMap->super_IInterface)._vptr_IInterface[2])(pMap,(ulong)(uint)piVar4[5]);
          uVar6 = 1;
          if (*piVar4 != 1) {
            uVar6 = (ulong)(uint)piVar4[6];
          }
          pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
          iVar10 = (*(pIVar1->super_IInterface)._vptr_IInterface[0x10])
                             (pIVar1,(ulong)(uint)piVar4[1],(ulong)(uint)piVar4[2],uVar6,
                              CONCAT44(extraout_var_01,iVar10),1,(int)uVar12);
          paVar11->m_aTextures[uVar8].m_Id = iVar10;
          (*(pMap->super_IInterface)._vptr_IInterface[4])(pMap,(ulong)(uint)piVar4[5]);
        }
        else {
          iVar10 = (*(pMap->super_IInterface)._vptr_IInterface[2])(pMap,(ulong)(uint)piVar4[4]);
          str_format(local_238,0x200,"mapres/%s.png",CONCAT44(extraout_var_00,iVar10));
          pIVar1 = ((this->super_CComponent).m_pClient)->m_pGraphics;
          iVar10 = (*(pIVar1->super_IInterface)._vptr_IInterface[0x12])
                             (pIVar1,local_238,0xffffffff,0xffffffff,uVar12);
          paVar11->m_aTextures[uVar8].m_Id = iVar10;
        }
        uVar8 = uVar8 + 1;
      } while ((long)uVar8 < (long)this->m_Info[(uint)MapType].m_Count);
    }
    bVar2 = CGameClient::IsEaster((this->super_CComponent).m_pClient);
    if (bVar2) {
      GetEasterTexture(this);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CMapImages::LoadMapImages(IMap *pMap, class CLayers *pLayers, int MapType)
{
	if(MapType < 0 || MapType >= NUM_MAP_TYPES)
		return;

	// unload all textures
	for(int i = 0; i < m_Info[MapType].m_Count; i++)
		Graphics()->UnloadTexture(&(m_Info[MapType].m_aTextures[i]));
	m_Info[MapType].m_Count = 0;

	int Start;
	pMap->GetType(MAPITEMTYPE_IMAGE, &Start, &m_Info[MapType].m_Count);
	m_Info[MapType].m_Count = clamp(m_Info[MapType].m_Count, 0, int(MAX_TEXTURES));

	// load new textures
	for(int i = 0; i < m_Info[MapType].m_Count; i++)
	{
		int TextureFlags = 0;
		bool FoundQuadLayer = false;
		bool FoundTileLayer = false;
		for(int k = 0; k < pLayers->NumLayers(); k++)
		{
			const CMapItemLayer * const pLayer = pLayers->GetLayer(k);
			if(!FoundQuadLayer && pLayer->m_Type == LAYERTYPE_QUADS && ((const CMapItemLayerQuads *)pLayer)->m_Image == i)
				FoundQuadLayer = true;
			if(!FoundTileLayer && pLayer->m_Type == LAYERTYPE_TILES && ((const CMapItemLayerTilemap *)pLayer)->m_Image == i)
				FoundTileLayer = true;
		}
		if(FoundTileLayer)
			TextureFlags = FoundQuadLayer ? IGraphics::TEXLOAD_MULTI_DIMENSION : IGraphics::TEXLOAD_ARRAY_256;

		CMapItemImage *pImg = (CMapItemImage *)pMap->GetItem(Start+i, 0, 0);
		if(pImg->m_External || (pImg->m_Version > 1 && pImg->m_Format != CImageInfo::FORMAT_RGB && pImg->m_Format != CImageInfo::FORMAT_RGBA))
		{
			char Buf[IO_MAX_PATH_LENGTH];
			char *pName = (char *)pMap->GetData(pImg->m_ImageName);
			str_format(Buf, sizeof(Buf), "mapres/%s.png", pName);
			m_Info[MapType].m_aTextures[i] = Graphics()->LoadTexture(Buf, IStorage::TYPE_ALL, CImageInfo::FORMAT_AUTO, TextureFlags);
		}
		else
		{
			void *pData = pMap->GetData(pImg->m_ImageData);
			m_Info[MapType].m_aTextures[i] = Graphics()->LoadTextureRaw(pImg->m_Width, pImg->m_Height, pImg->m_Version == 1 ? CImageInfo::FORMAT_RGBA : pImg->m_Format, pData, CImageInfo::FORMAT_RGBA, TextureFlags);
			pMap->UnloadData(pImg->m_ImageData);
		}
	}

	// easter time, preload easter tileset
	if(m_pClient->IsEaster())
		GetEasterTexture();
}